

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::AppendToList
          (ExtensionSet *this,Descriptor *containing_type,DescriptorPool *pool,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *output)

{
  int iVar1;
  FieldDescriptor *in_RAX;
  _Rb_tree_node_base *p_Var2;
  FieldDescriptor *local_38;
  
  p_Var2 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = in_RAX;
  do {
    if ((_Rb_tree_header *)p_Var2 == &(this->extensions_)._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    if (*(char *)((long)&p_Var2[1]._M_left + 1) == '\x01') {
      iVar1 = Extension::GetSize((Extension *)&p_Var2[1]._M_parent);
      if (0 < iVar1) {
LAB_005eb712:
        if (p_Var2[1]._M_right == (_Base_ptr)0x0) {
          local_38 = DescriptorPool::FindExtensionByNumber(pool,containing_type,p_Var2[1]._M_color);
          std::
          vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
          ::emplace_back<google::protobuf::FieldDescriptor_const*>
                    ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                      *)output,&local_38);
        }
        else {
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::push_back(output,(value_type *)&p_Var2[1]._M_right);
        }
      }
    }
    else if (((ulong)p_Var2[1]._M_left & 0x10000) == 0) goto LAB_005eb712;
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  } while( true );
}

Assistant:

void ExtensionSet::AppendToList(
    const Descriptor* containing_type,
    const DescriptorPool* pool,
    std::vector<const FieldDescriptor*>* output) const {
  for (ExtensionMap::const_iterator iter = extensions_.begin();
       iter != extensions_.end(); ++iter) {
    bool has = false;
    if (iter->second.is_repeated) {
      has = iter->second.GetSize() > 0;
    } else {
      has = !iter->second.is_cleared;
    }

    if (has) {
      // TODO(kenton): Looking up each field by number is somewhat unfortunate.
      //   Is there a better way?  The problem is that descriptors are lazily-
      //   initialized, so they might not even be constructed until
      //   AppendToList() is called.

      if (iter->second.descriptor == NULL) {
        output->push_back(pool->FindExtensionByNumber(
            containing_type, iter->first));
      } else {
        output->push_back(iter->second.descriptor);
      }
    }
  }
}